

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Type> *
wasm::WATParser::singlevaltype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  bool bVar1;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  undefined1 local_b8 [8];
  MaybeResult<wasm::Type> type;
  allocator<char> local_70 [32];
  undefined1 local_50 [8];
  MaybeResult<wasm::Type> _val;
  
  this = &ctx->in;
  expected._M_str = "i32";
  expected._M_len = 3;
  bVar1 = Lexer::takeKeyword(this,expected);
  if (bVar1) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = 2;
  }
  else {
    expected_00._M_str = "i64";
    expected_00._M_len = 3;
    bVar1 = Lexer::takeKeyword(this,expected_00);
    if (bVar1) {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> = 3;
    }
    else {
      expected_01._M_str = "f32";
      expected_01._M_len = 3;
      bVar1 = Lexer::takeKeyword(this,expected_01);
      if (bVar1) {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err> = 4;
      }
      else {
        expected_02._M_str = "f64";
        expected_02._M_len = 3;
        bVar1 = Lexer::takeKeyword(this,expected_02);
        if (bVar1) {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err> = 5;
        }
        else {
          expected_03._M_str = "v128";
          expected_03._M_len = 4;
          bVar1 = Lexer::takeKeyword(this,expected_03);
          if (!bVar1) {
            maybeReftype<wasm::WATParser::ParseTypeDefsCtx>((MaybeResult<wasm::Type> *)local_b8,ctx)
            ;
            if (type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                '\x01') {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)
                         ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
                         "expected valtype",local_70);
              Lexer::err((Err *)local_50,this,
                         (string *)
                         ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
              std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
              _Variant_storage<1ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,
                         local_50);
              std::__cxx11::string::~string((string *)local_50);
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
            }
            else {
              std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err>::
              _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_50,
                              (_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_b8)
              ;
              if (_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ ==
                  '\x02') {
                std::__cxx11::string::string((string *)local_70,(string *)local_50);
                std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
                _Variant_storage<1ul,wasm::Err>
                          ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,
                           local_70);
                std::__cxx11::string::~string((string *)local_70);
                std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>
                ::~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                                    local_50);
              }
              else {
                std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>
                ::~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                                    local_50);
                *(undefined1 (*) [8])
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_b8;
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
              }
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_b8
                             );
            return __return_storage_ptr__;
          }
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err> = 6;
        }
      }
    }
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> singlevaltype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = maybeReftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}